

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_widget_has_mouse_click_down(nk_context *ctx,nk_buttons btn,int down)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  nk_window *pnVar6;
  nk_panel *pnVar7;
  undefined1 auVar8 [16];
  undefined4 extraout_EAX;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  nk_rect bounds;
  nk_rect local_58;
  float local_48;
  float fStack_44;
  undefined8 uStack_40;
  float local_38;
  float fStack_34;
  undefined8 uStack_30;
  uint uVar12;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x49cb,
                  "int nk_widget_has_mouse_click_down(struct nk_context *, enum nk_buttons, int)");
  }
  pnVar6 = ctx->current;
  if (pnVar6 != (nk_window *)0x0) {
    uVar11 = 0;
    uVar12 = 0;
    if (ctx->active == pnVar6) {
      pnVar7 = pnVar6->layout;
      uVar2 = (pnVar7->clip).x;
      uVar4 = (pnVar7->clip).y;
      uVar3 = (pnVar7->clip).w;
      uVar5 = (pnVar7->clip).h;
      local_48 = (float)(int)(float)uVar2;
      fStack_44 = (float)(int)(float)uVar4;
      uStack_40 = 0;
      local_38 = (float)(int)(float)uVar3;
      fStack_34 = (float)(int)(float)uVar5;
      uStack_30 = 0;
      nk_layout_peek(&local_58,ctx);
      auVar8._4_4_ = -(uint)(fStack_34 + fStack_44 < local_58.y);
      auVar8._0_4_ = -(uint)(local_38 + local_48 < local_58.x);
      auVar8._8_4_ = -(uint)(local_58.w + local_58.x < local_48);
      auVar8._12_4_ = -(uint)(local_58.h + local_58.y < fStack_44);
      iVar9 = movmskps(extraout_EAX,auVar8);
      if (iVar9 == 0) {
        uVar10 = (ulong)btn;
        fVar1 = *(float *)((long)(ctx->style).cursors + uVar10 * 0x10 + -100);
        if ((((local_58.x <= fVar1) && (uVar11 = uVar12, fVar1 < local_58.x + local_58.w)) &&
            (fVar1 = *(float *)((ctx->style).cursors + uVar10 * 2 + -0xc), local_58.y <= fVar1)) &&
           (fVar1 < local_58.y + local_58.h)) {
          uVar11 = (uint)((ctx->input).mouse.buttons[uVar10].down == down);
        }
      }
    }
    return uVar11;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x49cc,
                "int nk_widget_has_mouse_click_down(struct nk_context *, enum nk_buttons, int)");
}

Assistant:

NK_API int
nk_widget_has_mouse_click_down(struct nk_context *ctx, enum nk_buttons btn, int down)
{
    struct nk_rect c, v;
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current || ctx->active != ctx->current)
        return 0;

    c = ctx->current->layout->clip;
    c.x = (float)((int)c.x);
    c.y = (float)((int)c.y);
    c.w = (float)((int)c.w);
    c.h = (float)((int)c.h);

    nk_layout_peek(&bounds, ctx);
    nk_unify(&v, &c, bounds.x, bounds.y, bounds.x + bounds.w, bounds.y + bounds.h);
    if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds.x, bounds.y, bounds.w, bounds.h))
        return 0;
    return nk_input_has_mouse_click_down_in_rect(&ctx->input, btn, bounds, down);
}